

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetRepaintManager::sync(QWidgetRepaintManager *this)

{
  bool bVar1;
  QDebug *pQVar2;
  ulong uVar3;
  QPlatformTextureList *pQVar4;
  QWidget *in_RDX;
  QWidgetRepaintManager *in_RSI;
  long in_FS_OFFSET;
  QPlatformTextureList *widgetTextures;
  QPoint offset;
  QWidgetRepaintManager *in_stack_00000098;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff38;
  QWidgetRepaintManager *in_stack_ffffffffffffff40;
  QWidget *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar5;
  QWidget *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff88;
  QRegion in_stack_ffffffffffffff90;
  QRegion *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffa0;
  QWidgetRepaintManager *in_stack_ffffffffffffffa8;
  QWidget *in_stack_ffffffffffffffb8;
  QDebug in_stack_ffffffffffffffc0;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetPainting();
  anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3a6abb);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (char *)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
               (char *)in_stack_ffffffffffffff38,(char *)0x3a6ad1);
    QMessageLogger::info();
    pQVar2 = QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffff88);
    QDebug::QDebug(&local_38,pQVar2);
    ::operator<<((QDebug *)&local_30,(QRegion *)&local_38);
    pQVar2 = QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffff88);
    QDebug::QDebug(&local_28,pQVar2);
    ::operator<<((QDebug *)in_stack_ffffffffffffffc0.stream,in_stack_ffffffffffffffb8);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc0);
    local_10 = 0;
  }
  bVar1 = QWidget::isVisible((QWidget *)0x3a6bba);
  if ((((bVar1) && (in_RSI != (QWidgetRepaintManager *)0x0)) &&
      (bVar1 = hasPlatformWindow((QWidget *)in_stack_ffffffffffffff40), bVar1)) &&
     (((bVar1 = QWidget::isVisible((QWidget *)0x3a6be5), bVar1 &&
       (bVar1 = QWidget::testAttribute
                          (in_stack_ffffffffffffff48,
                           (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20)), bVar1)) &&
      ((bVar1 = QWidget::updatesEnabled((QWidget *)0x3a6c0a), bVar1 &&
       (uVar3 = QRegion::isEmpty(), (uVar3 & 1) == 0)))))) {
    bVar1 = isDirty(in_stack_ffffffffffffff40);
    uVar5 = false;
    if (!bVar1) {
      in_stack_ffffffffffffff98 = (QRegion *)QBackingStore::size();
      uVar5 = QSize::isValid((QSize *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
    }
    if ((bool)uVar5 == false) {
      if (in_RSI == *(QWidgetRepaintManager **)this) {
        QPoint::QPoint((QPoint *)in_stack_ffffffffffffff40);
      }
      else {
        QPoint::QPoint(*(QPoint **)this);
        QWidget::mapTo(in_stack_ffffffffffffff60,(QWidget *)this,
                       (QPoint *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
      }
      markNeedsFlush(in_RSI,in_RDX,(QRegion *)in_stack_ffffffffffffff60,(QPoint *)this);
      bVar1 = syncAllowed(in_RSI);
      if (bVar1) {
        paintAndFlush(in_stack_00000098);
      }
    }
    else {
      pQVar4 = widgetTexturesFor((QWidget *)in_RSI,in_RDX);
      if (pQVar4 == (QPlatformTextureList *)0x0) {
        QRegion::QRegion((QRegion *)&stack0xffffffffffffff90,(QRegion *)in_RDX);
      }
      else {
        QRegion::QRegion((QRegion *)&stack0xffffffffffffff90);
      }
      flush(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
            (QPlatformTextureList *)in_stack_ffffffffffffff90.d);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffff90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::sync(QWidget *exposedWidget, const QRegion &exposedRegion)
{
    qCInfo(lcWidgetPainting) << "Syncing" << exposedRegion << "of" << exposedWidget;

    if (!tlw->isVisible())
        return;

    if (!exposedWidget || !hasPlatformWindow(exposedWidget)
        || !exposedWidget->isVisible() || !exposedWidget->testAttribute(Qt::WA_Mapped)
        || !exposedWidget->updatesEnabled() || exposedRegion.isEmpty()) {
        return;
    }

    // Nothing to repaint.
    if (!isDirty() && store->size().isValid()) {
        QPlatformTextureList *widgetTextures = widgetTexturesFor(tlw, exposedWidget);
        flush(exposedWidget, widgetTextures ? QRegion() : exposedRegion, widgetTextures);
        return;
    }

    // As requests to sync a specific widget typically comes from an expose event
    // we can't rely solely on our own dirty tracking to decide what to flush, and
    // need to respect the platform's request to at least flush the entire widget,
    QPoint offset = exposedWidget != tlw ? exposedWidget->mapTo(tlw, QPoint()) : QPoint();
    markNeedsFlush(exposedWidget, exposedRegion, offset);

    if (syncAllowed())
        paintAndFlush();
}